

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void quicly_send_datagram_frames(quicly_conn_t *conn,ptls_iovec_t *datagrams,size_t num_datagrams)

{
  size_t sVar1;
  size_t __size;
  uint8_t *__dest;
  size_t *psVar2;
  bool bVar3;
  
  psVar2 = &datagrams->len;
  while ((bVar3 = num_datagrams != 0, num_datagrams = num_datagrams - 1, bVar3 &&
         (sVar1 = (conn->egress).datagram_frame_payloads.count, sVar1 != 10))) {
    __size = *psVar2;
    __dest = (uint8_t *)malloc(__size);
    if (__dest == (uint8_t *)0x0) {
      return;
    }
    memcpy(__dest,((ptls_iovec_t *)(psVar2 + -1))->base,__size);
    (conn->egress).datagram_frame_payloads.count = sVar1 + 1;
    (conn->egress).datagram_frame_payloads.payloads[sVar1].base = __dest;
    (conn->egress).datagram_frame_payloads.payloads[sVar1].len = __size;
    psVar2 = psVar2 + 2;
  }
  return;
}

Assistant:

void quicly_send_datagram_frames(quicly_conn_t *conn, ptls_iovec_t *datagrams, size_t num_datagrams)
{
    for (size_t i = 0; i != num_datagrams; ++i) {
        if (conn->egress.datagram_frame_payloads.count == PTLS_ELEMENTSOF(conn->egress.datagram_frame_payloads.payloads))
            break;
        void *copied;
        if ((copied = malloc(datagrams[i].len)) == NULL)
            break;
        memcpy(copied, datagrams[i].base, datagrams[i].len);
        conn->egress.datagram_frame_payloads.payloads[conn->egress.datagram_frame_payloads.count++] =
            ptls_iovec_init(copied, datagrams[i].len);
    }
}